

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O1

void Typelib::CXX::addStandardTypes(Registry *registry)

{
  char cVar1;
  string *this;
  Type *on;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/bool","");
  cVar1 = Typelib::Registry::has((string *)registry,SUB81(local_68,0));
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (cVar1 == '\0') {
    ::addStandardTypes(registry);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/std/string","");
  cVar1 = Typelib::Registry::has((string *)registry,SUB81(local_68,0));
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (cVar1 == '\0') {
    this = (string *)operator_new(0x68);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/int8_t","");
    on = (Type *)Typelib::Registry::get((string *)registry);
    String::String((String *)this,on);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
    Typelib::Registry::add((Type *)registry,this);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  return;
}

Assistant:

void Typelib::CXX::addStandardTypes(Typelib::Registry& registry)
{
    if (!registry.has("/bool"))
        ::addStandardTypes(registry);
    if (!registry.has("/std/string"))
        registry.add(new String(*registry.get("/int8_t")));
}